

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.cpp
# Opt level: O3

char * start_capture(MatchState *ms,char *s,char *p,int what)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  
  iVar1 = ms->level;
  lVar3 = (long)iVar1;
  if (0x1f < lVar3) {
    luaL_error(ms->L,"too many captures");
  }
  ms->capture[lVar3].init = s;
  ms->capture[lVar3].len = (long)what;
  ms->level = iVar1 + 1;
  pcVar2 = match(ms,s,p);
  if (pcVar2 == (char *)0x0) {
    ms->level = ms->level + -1;
  }
  return pcVar2;
}

Assistant:

static const char *start_capture (MatchState *ms, const char *s,
                                    const char *p, int what) {
  const char *res;
  int level = ms->level;
  if (level >= LUA_MAXCAPTURES) luaL_error(ms->L, "too many captures");
  ms->capture[level].init = s;
  ms->capture[level].len = what;
  ms->level = level+1;
  if ((res=match(ms, s, p)) == NULL)  /* match failed? */
    ms->level--;  /* undo capture */
  return res;
}